

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

Index __thiscall
TwoStageDynamicBayesianNetwork::IndividualToJointOiiIndices
          (TwoStageDynamicBayesianNetwork *this,Index o,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Os)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  Index IVar2;
  
  pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
           this->_m_IndividualToJointOiiIndices_catVector;
  if (*(long *)(pvVar1 + 8) != *(long *)pvVar1) {
    *(long *)(pvVar1 + 8) = *(long *)pvVar1;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (pvVar1,*(undefined8 *)(pvVar1 + 8),
             (As->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (As->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             this->_m_IndividualToJointOiiIndices_catVector,
             *(undefined8 *)
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               this->_m_IndividualToJointOiiIndices_catVector + 8),
             (Ys->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (Ys->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             this->_m_IndividualToJointOiiIndices_catVector,
             *(undefined8 *)
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               this->_m_IndividualToJointOiiIndices_catVector + 8),
             (Os->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (Os->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  IVar2 = IndexTools::IndividualToJointIndicesStepSize
                    (this->_m_IndividualToJointOiiIndices_catVector,
                     (this->_m_nrVals_SoI_O_stepsize).
                     super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                     super__Vector_impl_data._M_start[o]);
  return IVar2;
}

Assistant:

Index TwoStageDynamicBayesianNetwork::
IndividualToJointOiiIndices(Index o, 
        const vector<Index>& As, 
        const vector<Index>& Ys, 
        const vector<Index>& Os) const
{
    _m_IndividualToJointOiiIndices_catVector->clear();
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), As.begin(), As.end() );
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), Ys.begin(), Ys.end() );
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), Os.begin(), Os.end() );

    Index iiI = IndexTools::IndividualToJointIndicesStepSize(
        *_m_IndividualToJointOiiIndices_catVector,
        _m_nrVals_SoI_O_stepsize[o] );
    return iiI;

}